

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O3

void am_before_match_do_method_proc(Am_Object *cmd_or_inter)

{
  Am_Value *pAVar1;
  ostream *poVar2;
  Am_Object match_command;
  Am_Object_Method do_method;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object_Method local_20;
  
  pAVar1 = Am_Object::Get(cmd_or_inter,Am_INVOKE_MATCH_COMMAND,0);
  Am_Object::Am_Object(&local_28,pAVar1);
  match_and_run(cmd_or_inter,&local_28);
  pAVar1 = Am_Object::Get(cmd_or_inter,Am_REAL_DO_METHOD,0);
  Am_Object_Method::Am_Object_Method(&local_20,pAVar1);
  if (local_20.Call != (Am_Object_Method_Type *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%% Calling ",0xb);
    poVar2 = operator<<((ostream *)&std::cout,&local_20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," of ",4);
    poVar2 = operator<<(poVar2,cmd_or_inter);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::ostream::flush();
    Am_Object::Am_Object(&local_30,cmd_or_inter);
    (*local_20.Call)((Am_Object_Data *)&local_30);
    Am_Object::~Am_Object(&local_30);
  }
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_before_match_do_method,
                 (Am_Object cmd_or_inter))
{
  Am_Object match_command = cmd_or_inter.Get(Am_INVOKE_MATCH_COMMAND);
  match_and_run(cmd_or_inter, match_command);
  Am_Object_Method do_method = cmd_or_inter.Get(Am_REAL_DO_METHOD);
  if (do_method.Valid()) {
    std::cout << "%% Calling " << do_method << " of " << cmd_or_inter
              << std::endl
              << std::flush;
    do_method.Call(cmd_or_inter);
  }
}